

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Real Omega_h::repro_sum(CommPtr *comm,Reals *a)

{
  int iVar1;
  element_type *peVar2;
  CommPtr *pCVar3;
  Int128 IVar4;
  double ret;
  int64_t local_80;
  uint64_t local_78;
  Read<double> local_70;
  undefined1 local_60 [8];
  Int128 fixpt_sum;
  double unit;
  int expo;
  Read<double> local_38;
  int local_28;
  undefined4 local_24;
  int expo0;
  int init;
  Reals *a_local;
  CommPtr *comm_local;
  
  _expo0 = a;
  a_local = (Reals *)comm;
  begin_code("repro_sum(comm)",(char *)0x0);
  local_24 = 0x80000000;
  Read<double>::Read(&local_38,a);
  iVar1 = max_exponent(&local_38);
  Read<double>::~Read(&local_38);
  local_28 = iVar1;
  peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)comm);
  iVar1 = Comm::allreduce<int>(peVar2,local_28,OMEGA_H_MAX);
  if (iVar1 == -0x80000000) {
    comm_local = (CommPtr *)0x0;
  }
  else {
    fixpt_sum.low = (uint64_t)exp2((double)(iVar1 + -0x34));
    Read<double>::Read(&local_70,a);
    IVar4 = int128_sum(&local_70,(double)fixpt_sum.low);
    fixpt_sum.high = IVar4.low;
    local_60 = (undefined1  [8])IVar4.high;
    Read<double>::~Read(&local_70);
    peVar2 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    IVar4.low = fixpt_sum.high;
    IVar4.high = (int64_t)local_60;
    IVar4 = Comm::add_int128(peVar2,IVar4);
    local_80 = IVar4.high;
    local_60 = (undefined1  [8])local_80;
    local_78 = IVar4.low;
    fixpt_sum.high = local_78;
    pCVar3 = (CommPtr *)Int128::to_double((Int128 *)local_60,(double)fixpt_sum.low);
    end_code();
    comm_local = pCVar3;
  }
  return (Real)comm_local;
}

Assistant:

Real repro_sum(CommPtr comm, Reals a) {
  begin_code("repro_sum(comm)");
  auto const init = ArithTraits<int>::min();
  auto expo0 = max_exponent(a);
  int expo = comm->allreduce(expo0, OMEGA_H_MAX);
  if (expo == init) return 0.0;
  double unit = exp2(double(expo - MANTISSA_BITS));
  Int128 fixpt_sum = int128_sum(a, unit);
  fixpt_sum = comm->add_int128(fixpt_sum);
  double ret = fixpt_sum.to_double(unit);
  end_code();
  return ret;
}